

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O0

void __thiscall ON_ThickeningUserData::SetToDefaults(ON_ThickeningUserData *this)

{
  bool bVar1;
  long *plVar2;
  ON_XMLNode *pOVar3;
  double dValue;
  ON_XMLVariant local_580;
  ON_XMLVariant local_488;
  ON_XMLVariant local_390;
  ON_XMLVariant local_298;
  ON_XMLVariant local_1a0;
  undefined1 local_a8 [8];
  ON_XMLParameters p;
  Defaults d;
  ON_XMLNode *root;
  ON_XMLProperty prop;
  ON_ThickeningUserData *ud;
  ON_ThickeningUserData *this_local;
  
  prop._PRIVATE._80_8_ = this;
  (*(this->super_ON_XMLUserData).super_ON_UserData.super_ON_Object._vptr_ON_Object[0x24])();
  ON_XMLProperty::ON_XMLProperty((ON_XMLProperty *)&root);
  plVar2 = (long *)(**(code **)(*(long *)prop._PRIVATE._80_8_ + 0xf8))();
  pOVar3 = (ON_XMLNode *)operator_new(0xe8);
  ON_XMLNode::ON_XMLNode(pOVar3,L"thickening-object-data");
  pOVar3 = (ON_XMLNode *)(**(code **)(*plVar2 + 0x58))(plVar2,pOVar3);
  ON_XMLParameters::ON_XMLParameters((ON_XMLParameters *)local_a8,pOVar3);
  ::ON_XMLVariant::ON_XMLVariant(&local_1a0,false);
  ON_XMLParameters::SetParam((ON_XMLParameters *)local_a8,L"on",&local_1a0);
  ::ON_XMLVariant::~ON_XMLVariant(&local_1a0);
  bVar1 = ON_Thickening::Defaults::Solid();
  ::ON_XMLVariant::ON_XMLVariant(&local_298,bVar1);
  ON_XMLParameters::SetParam((ON_XMLParameters *)local_a8,L"solid",&local_298);
  ::ON_XMLVariant::~ON_XMLVariant(&local_298);
  bVar1 = ON_Thickening::Defaults::BothSides();
  ::ON_XMLVariant::ON_XMLVariant(&local_390,bVar1);
  ON_XMLParameters::SetParam((ON_XMLParameters *)local_a8,L"both-sides",&local_390);
  ::ON_XMLVariant::~ON_XMLVariant(&local_390);
  bVar1 = ON_Thickening::Defaults::OffsetOnly();
  ::ON_XMLVariant::ON_XMLVariant(&local_488,bVar1);
  ON_XMLParameters::SetParam((ON_XMLParameters *)local_a8,L"offset-only",&local_488);
  ::ON_XMLVariant::~ON_XMLVariant(&local_488);
  dValue = ON_Thickening::Defaults::Distance();
  ::ON_XMLVariant::ON_XMLVariant(&local_580,dValue);
  ON_XMLParameters::SetParam((ON_XMLParameters *)local_a8,L"distance",&local_580);
  ::ON_XMLVariant::~ON_XMLVariant(&local_580);
  ON_XMLParameters::~ON_XMLParameters((ON_XMLParameters *)local_a8);
  ON_XMLProperty::~ON_XMLProperty((ON_XMLProperty *)&root);
  return;
}

Assistant:

void ON_ThickeningUserData::SetToDefaults(void) const
{
  auto& ud = const_cast<ON_ThickeningUserData&>(*this);
  ud.Clear();

  ON_XMLProperty prop;
  ON_XMLNode* root = ud.XMLRootForWrite().AttachChildNode(new ON_XMLNode(ON_THICKENING_ROOT));

  ON_Thickening::Defaults d;

  ON_XMLParameters p(*root);
  p.SetParam(ON_THICKENING_ON, false);
  p.SetParam(ON_THICKENING_SOLID, d.Solid());
  p.SetParam(ON_THICKENING_BOTH_SIDES, d.BothSides());
  p.SetParam(ON_THICKENING_OFFSET_ONLY, d.OffsetOnly());
  p.SetParam(ON_THICKENING_DISTANCE, d.Distance());
}